

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

void SetPortal(sector_t *sector,int plane,uint pnum,double alpha)

{
  int iVar1;
  FSectorPortal *pFVar2;
  double dVar3;
  double alpha_local;
  uint pnum_local;
  int plane_local;
  sector_t *sector_local;
  
  if ((0 < plane) && (iVar1 = sector_t::GetPortalType(sector,1), iVar1 == 0)) {
    sector->Portals[1] = pnum;
    dVar3 = sector_t::GetAlpha(sector,1);
    if ((dVar3 == 1.0) && (!NAN(dVar3))) {
      sector_t::SetAlpha(sector,1,alpha);
    }
    pFVar2 = TArray<FSectorPortal,_FSectorPortal>::operator[](&sectorPortals,(ulong)pnum);
    if ((pFVar2->mFlags & 1U) != 0) {
      sector_t::SetTexture(sector,1,skyflatnum,true);
    }
  }
  if ((plane == 2) || (plane == 0)) {
    iVar1 = sector_t::GetPortalType(sector,0);
    if (iVar1 == 0) {
      sector->Portals[0] = pnum;
    }
    dVar3 = sector_t::GetAlpha(sector,0);
    if ((dVar3 == 1.0) && (!NAN(dVar3))) {
      sector_t::SetAlpha(sector,0,alpha);
    }
    pFVar2 = TArray<FSectorPortal,_FSectorPortal>::operator[](&sectorPortals,(ulong)pnum);
    if ((pFVar2->mFlags & 1U) != 0) {
      sector_t::SetTexture(sector,0,skyflatnum,true);
    }
  }
  return;
}

Assistant:

static void SetPortal(sector_t *sector, int plane, unsigned pnum, double alpha)
{
	// plane: 0=floor, 1=ceiling, 2=both
	if (plane > 0)
	{
		if (sector->GetPortalType(sector_t::ceiling) == PORTS_SKYVIEWPOINT)
		{
			sector->Portals[sector_t::ceiling] = pnum;
			if (sector->GetAlpha(sector_t::ceiling) == 1.)
				sector->SetAlpha(sector_t::ceiling, alpha);

			if (sectorPortals[pnum].mFlags & PORTSF_SKYFLATONLY)
				sector->SetTexture(sector_t::ceiling, skyflatnum);
		}
	}
	if (plane == 2 || plane == 0)
	{
		if (sector->GetPortalType(sector_t::floor) == PORTS_SKYVIEWPOINT)
		{
			sector->Portals[sector_t::floor] = pnum;
		}
		if (sector->GetAlpha(sector_t::floor) == 1.)
			sector->SetAlpha(sector_t::floor, alpha);

		if (sectorPortals[pnum].mFlags & PORTSF_SKYFLATONLY)
			sector->SetTexture(sector_t::floor, skyflatnum);
	}
}